

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Node::~Node(Node *this)

{
  Node *this_00;
  bool bVar1;
  reference ppNVar2;
  __normal_iterator<Assimp::Collada::Node_**,_std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>_>
  local_20;
  __normal_iterator<Assimp::Collada::Node_**,_std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>_>
  local_18;
  iterator it;
  Node *this_local;
  
  it._M_current = (Node **)this;
  local_18._M_current =
       (Node **)std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
                begin(&this->mChildren);
  while( true ) {
    local_20._M_current =
         (Node **)std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
                  end(&this->mChildren);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Collada::Node_**,_std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppNVar2;
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::Node_**,_std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>_>
    ::operator++(&local_18);
  }
  std::__cxx11::string::~string((string *)&this->mPrimaryCamera);
  std::vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>::
  ~vector(&this->mNodeInstances);
  std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>::
  ~vector(&this->mCameras);
  std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>::
  ~vector(&this->mLights);
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  ~vector(&this->mMeshes);
  std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::~vector
            (&this->mTransforms);
  std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::~vector
            (&this->mChildren);
  std::__cxx11::string::~string((string *)&this->mSID);
  std::__cxx11::string::~string((string *)&this->mID);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Node() {
        for( std::vector<Node*>::iterator it = mChildren.begin(); it != mChildren.end(); ++it)
            delete *it;
    }